

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

void opj_image_comp_header_update(opj_image_t *p_image_header,opj_cp *p_cp)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  OPJ_UINT32 OVar9;
  OPJ_UINT32 OVar10;
  ulong uVar11;
  OPJ_UINT32 OVar12;
  opj_image_comp_t *poVar13;
  uint uVar14;
  ulong uVar15;
  
  OVar12 = p_image_header->numcomps;
  if (OVar12 != 0) {
    poVar13 = p_image_header->comps;
    uVar2 = p_cp->tdy;
    uVar3 = p_cp->tx0;
    uVar4 = p_cp->ty0;
    uVar14 = (p_cp->th - 1) * uVar2 + uVar4;
    uVar5 = uVar14 + uVar2;
    if (CARRY4(uVar14,uVar2)) {
      uVar5 = 0xffffffff;
    }
    if (p_image_header->y1 <= uVar5) {
      uVar5 = p_image_header->y1;
    }
    uVar2 = p_cp->tdx;
    uVar8 = (p_cp->tw - 1) * uVar2 + uVar3;
    uVar14 = uVar8 + uVar2;
    if (CARRY4(uVar8,uVar2)) {
      uVar14 = 0xffffffff;
    }
    if (p_image_header->x1 <= uVar14) {
      uVar14 = p_image_header->x1;
    }
    uVar2 = p_image_header->y0;
    if (p_image_header->y0 < uVar4) {
      uVar2 = uVar4;
    }
    uVar15 = (ulong)p_image_header->x0;
    if (p_image_header->x0 < uVar3) {
      uVar15 = (ulong)uVar3;
    }
    do {
      uVar11 = (ulong)poVar13->dx;
      if ((uVar11 == 0) || (uVar6 = (ulong)poVar13->dy, uVar6 == 0)) {
        __assert_fail("b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                      ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
      }
      bVar1 = (byte)poVar13->factor;
      OVar9 = (OPJ_UINT32)(((uVar11 + uVar15) - 1) / uVar11);
      uVar7 = ~(-1L << (bVar1 & 0x3f));
      OVar10 = (OPJ_UINT32)(((uVar6 + uVar2) - 1) / uVar6);
      poVar13->w = (OPJ_UINT32)
                   (((int)(((uVar11 + uVar14) - 1) / uVar11) - OVar9) + uVar7 >> (bVar1 & 0x3f));
      poVar13->h = (OPJ_UINT32)
                   (((int)(((uVar6 + uVar5) - 1) / uVar6) - OVar10) + uVar7 >> (bVar1 & 0x3f));
      poVar13->x0 = OVar9;
      poVar13->y0 = OVar10;
      poVar13 = poVar13 + 1;
      OVar12 = OVar12 - 1;
    } while (OVar12 != 0);
  }
  return;
}

Assistant:

void opj_image_comp_header_update(opj_image_t * p_image_header,
                                  const struct opj_cp * p_cp)
{
    OPJ_UINT32 i, l_width, l_height;
    OPJ_UINT32 l_x0, l_y0, l_x1, l_y1;
    OPJ_UINT32 l_comp_x0, l_comp_y0, l_comp_x1, l_comp_y1;
    opj_image_comp_t* l_img_comp = NULL;

    l_x0 = opj_uint_max(p_cp->tx0, p_image_header->x0);
    l_y0 = opj_uint_max(p_cp->ty0, p_image_header->y0);
    l_x1 = p_cp->tx0 + (p_cp->tw - 1U) *
           p_cp->tdx; /* validity of p_cp members used here checked in opj_j2k_read_siz. Can't overflow. */
    l_y1 = p_cp->ty0 + (p_cp->th - 1U) * p_cp->tdy; /* can't overflow */
    l_x1 = opj_uint_min(opj_uint_adds(l_x1, p_cp->tdx),
                        p_image_header->x1); /* use add saturated to prevent overflow */
    l_y1 = opj_uint_min(opj_uint_adds(l_y1, p_cp->tdy),
                        p_image_header->y1); /* use add saturated to prevent overflow */

    l_img_comp = p_image_header->comps;
    for (i = 0; i < p_image_header->numcomps; ++i) {
        l_comp_x0 = opj_uint_ceildiv(l_x0, l_img_comp->dx);
        l_comp_y0 = opj_uint_ceildiv(l_y0, l_img_comp->dy);
        l_comp_x1 = opj_uint_ceildiv(l_x1, l_img_comp->dx);
        l_comp_y1 = opj_uint_ceildiv(l_y1, l_img_comp->dy);
        l_width   = opj_uint_ceildivpow2(l_comp_x1 - l_comp_x0, l_img_comp->factor);
        l_height  = opj_uint_ceildivpow2(l_comp_y1 - l_comp_y0, l_img_comp->factor);
        l_img_comp->w = l_width;
        l_img_comp->h = l_height;
        l_img_comp->x0 = l_comp_x0;
        l_img_comp->y0 = l_comp_y0;
        ++l_img_comp;
    }
}